

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::sse2::
     BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  uint uVar1;
  ulong uVar2;
  Geometry *this;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 (*pauVar6) [16];
  bool bVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  size_t i;
  long lVar15;
  undefined4 uVar16;
  ulong unaff_R15;
  undefined4 uVar18;
  long lVar17;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar39;
  float fVar40;
  undefined1 auVar36 [16];
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar51;
  float fVar52;
  undefined1 auVar50 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  float local_1028 [4];
  ulong local_1018;
  undefined1 (*local_1010) [16];
  long local_1008;
  ulong local_1000;
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [8];
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  local_1038._4_4_ = (query->p).field_0.field_0.x;
  local_1048._4_4_ = (query->p).field_0.field_0.y;
  local_1058._4_4_ = (query->p).field_0.field_0.z;
  fVar58 = (context->query_radius).field_0.m128[0];
  fVar35 = (context->query_radius).field_0.m128[1];
  fVar39 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    fStack_f90 = 0.0;
    fStack_f94 = 0.0;
    local_f98 = query->radius * query->radius;
  }
  else {
    fVar40 = (context->query_radius).field_0.m128[0];
    fVar41 = (context->query_radius).field_0.m128[1];
    fStack_f90 = (context->query_radius).field_0.m128[2];
    fStack_f94 = (context->query_radius).field_0.m128[3];
    fStack_f90 = fStack_f90 * fStack_f90;
    fStack_f94 = fStack_f94 * fStack_f94;
    local_f98 = fStack_f90 + fVar41 * fVar41 + fVar40 * fVar40;
  }
  local_1010 = (undefined1 (*) [16])local_f68;
  local_1038._0_4_ = local_1038._4_4_;
  fStack_1030 = (float)local_1038._4_4_;
  fStack_102c = (float)local_1038._4_4_;
  local_1048._0_4_ = local_1048._4_4_;
  fStack_1040 = (float)local_1048._4_4_;
  fStack_103c = (float)local_1048._4_4_;
  local_1058._0_4_ = local_1058._4_4_;
  fStack_1050 = (float)local_1058._4_4_;
  fStack_104c = (float)local_1058._4_4_;
  bVar8 = false;
  local_1018 = unaff_R15;
  do {
    local_fc8 = (float)local_1038._4_4_ - fVar58;
    fStack_fc4 = (float)local_1038._4_4_ - fVar58;
    fStack_fc0 = (float)local_1038._4_4_ - fVar58;
    fStack_fbc = (float)local_1038._4_4_ - fVar58;
    local_fd8 = (float)local_1038._4_4_ + fVar58;
    fStack_fd4 = (float)local_1038._4_4_ + fVar58;
    fStack_fd0 = (float)local_1038._4_4_ + fVar58;
    fStack_fcc = (float)local_1038._4_4_ + fVar58;
    local_fe8._0_4_ = (float)local_1048._4_4_ - fVar35;
    local_fe8._4_4_ = (float)local_1048._4_4_ - fVar35;
    fStack_fe0 = (float)local_1048._4_4_ - fVar35;
    fStack_fdc = (float)local_1048._4_4_ - fVar35;
    local_fa8 = fVar35 + (float)local_1048._4_4_;
    fStack_fa4 = fVar35 + (float)local_1048._4_4_;
    fStack_fa0 = fVar35 + (float)local_1048._4_4_;
    fStack_f9c = fVar35 + (float)local_1048._4_4_;
    local_ff8._0_4_ = (float)local_1058._4_4_ - fVar39;
    local_ff8._4_4_ = (float)local_1058._4_4_ - fVar39;
    fStack_ff0 = (float)local_1058._4_4_ - fVar39;
    fStack_fec = (float)local_1058._4_4_ - fVar39;
    local_fb8._0_4_ = fVar39 + (float)local_1058._4_4_;
    local_fb8._4_4_ = fVar39 + (float)local_1058._4_4_;
    fStack_fb0 = fVar39 + (float)local_1058._4_4_;
    fStack_fac = fVar39 + (float)local_1058._4_4_;
    local_f88._0_4_ = fVar58 * fVar58;
    local_f88._4_4_ = fVar58 * fVar58;
    fStack_f80 = fVar58 * fVar58;
    fStack_f7c = fVar58 * fVar58;
    fStack_f8c = fStack_f94;
    fVar58 = local_f98;
    do {
      do {
        do {
          if (local_1010 == (undefined1 (*) [16])local_f78) {
            return bVar8;
          }
          pauVar6 = local_1010 + -1;
          local_1010 = local_1010 + -1;
        } while (fVar58 < *(float *)(*pauVar6 + 8));
        uVar11 = *(ulong *)*local_1010;
        do {
          uVar18 = (undefined4)(local_1018 >> 0x20);
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar11 & 8) == 0) {
              uVar10 = uVar11 & 0xfffffffffffffff0;
              fVar35 = query->time;
              auVar21._4_4_ = fVar35;
              auVar21._0_4_ = fVar35;
              auVar21._8_4_ = fVar35;
              auVar21._12_4_ = fVar35;
              auVar24._0_4_ = *(float *)(uVar10 + 0x80) * fVar35 + *(float *)(uVar10 + 0x20);
              auVar24._4_4_ = *(float *)(uVar10 + 0x84) * fVar35 + *(float *)(uVar10 + 0x24);
              auVar24._8_4_ = *(float *)(uVar10 + 0x88) * fVar35 + *(float *)(uVar10 + 0x28);
              auVar24._12_4_ = *(float *)(uVar10 + 0x8c) * fVar35 + *(float *)(uVar10 + 0x2c);
              auVar36._0_4_ = *(float *)(uVar10 + 0xa0) * fVar35 + *(float *)(uVar10 + 0x40);
              auVar36._4_4_ = *(float *)(uVar10 + 0xa4) * fVar35 + *(float *)(uVar10 + 0x44);
              auVar36._8_4_ = *(float *)(uVar10 + 0xa8) * fVar35 + *(float *)(uVar10 + 0x48);
              auVar36._12_4_ = *(float *)(uVar10 + 0xac) * fVar35 + *(float *)(uVar10 + 0x4c);
              auVar31._0_4_ = *(float *)(uVar10 + 0xc0) * fVar35 + *(float *)(uVar10 + 0x60);
              auVar31._4_4_ = *(float *)(uVar10 + 0xc4) * fVar35 + *(float *)(uVar10 + 100);
              auVar31._8_4_ = *(float *)(uVar10 + 200) * fVar35 + *(float *)(uVar10 + 0x68);
              auVar31._12_4_ = *(float *)(uVar10 + 0xcc) * fVar35 + *(float *)(uVar10 + 0x6c);
              auVar27._0_4_ = *(float *)(uVar10 + 0x90) * fVar35 + *(float *)(uVar10 + 0x30);
              auVar27._4_4_ = *(float *)(uVar10 + 0x94) * fVar35 + *(float *)(uVar10 + 0x34);
              auVar27._8_4_ = *(float *)(uVar10 + 0x98) * fVar35 + *(float *)(uVar10 + 0x38);
              auVar27._12_4_ = *(float *)(uVar10 + 0x9c) * fVar35 + *(float *)(uVar10 + 0x3c);
              auVar42._0_4_ = *(float *)(uVar10 + 0xb0) * fVar35 + *(float *)(uVar10 + 0x50);
              auVar42._4_4_ = *(float *)(uVar10 + 0xb4) * fVar35 + *(float *)(uVar10 + 0x54);
              auVar42._8_4_ = *(float *)(uVar10 + 0xb8) * fVar35 + *(float *)(uVar10 + 0x58);
              auVar42._12_4_ = *(float *)(uVar10 + 0xbc) * fVar35 + *(float *)(uVar10 + 0x5c);
              auVar45._0_4_ = *(float *)(uVar10 + 0xd0) * fVar35 + *(float *)(uVar10 + 0x70);
              auVar45._4_4_ = *(float *)(uVar10 + 0xd4) * fVar35 + *(float *)(uVar10 + 0x74);
              auVar45._8_4_ = *(float *)(uVar10 + 0xd8) * fVar35 + *(float *)(uVar10 + 0x78);
              auVar45._12_4_ = *(float *)(uVar10 + 0xdc) * fVar35 + *(float *)(uVar10 + 0x7c);
              auVar50 = maxps(_local_1038,auVar24);
              auVar50 = minps(auVar50,auVar27);
              fVar49 = auVar50._0_4_ - (float)local_1038._4_4_;
              fVar51 = auVar50._4_4_ - (float)local_1038._4_4_;
              fVar52 = auVar50._8_4_ - (float)local_1038._4_4_;
              fVar53 = auVar50._12_4_ - (float)local_1038._4_4_;
              auVar50 = maxps(_local_1048,auVar36);
              auVar50 = minps(auVar50,auVar42);
              fVar54 = auVar50._0_4_ - (float)local_1048._4_4_;
              fVar55 = auVar50._4_4_ - (float)local_1048._4_4_;
              fVar56 = auVar50._8_4_ - (float)local_1048._4_4_;
              fVar57 = auVar50._12_4_ - (float)local_1048._4_4_;
              auVar50 = maxps(_local_1058,auVar31);
              auVar50 = minps(auVar50,auVar45);
              fVar35 = auVar50._0_4_ - (float)local_1058._4_4_;
              fVar39 = auVar50._4_4_ - (float)local_1058._4_4_;
              fVar40 = auVar50._8_4_ - (float)local_1058._4_4_;
              fVar41 = auVar50._12_4_ - (float)local_1058._4_4_;
              local_1028[0] = fVar35 * fVar35 + fVar54 * fVar54 + fVar49 * fVar49;
              local_1028[1] = fVar39 * fVar39 + fVar55 * fVar55 + fVar51 * fVar51;
              local_1028[2] = fVar40 * fVar40 + fVar56 * fVar56 + fVar52 * fVar52;
              local_1028[3] = fVar41 * fVar41 + fVar57 * fVar57 + fVar53 * fVar53;
              auVar29._0_4_ =
                   -(uint)(auVar24._0_4_ <= auVar27._0_4_ && local_1028[0] <= (float)local_f88._0_4_
                          );
              auVar29._4_4_ =
                   -(uint)(auVar24._4_4_ <= auVar27._4_4_ && local_1028[1] <= (float)local_f88._4_4_
                          );
              auVar29._8_4_ = -(uint)(auVar24._8_4_ <= auVar27._8_4_ && local_1028[2] <= fStack_f80)
              ;
              auVar29._12_4_ =
                   -(uint)(auVar24._12_4_ <= auVar27._12_4_ && local_1028[3] <= fStack_f7c);
              if (((uint)uVar11 & 7) != 6) goto LAB_00dfd10c;
LAB_00dfd299:
              uVar10 = uVar11 & 0xfffffffffffffff0;
              auVar19._0_4_ =
                   (-(uint)(auVar21._0_4_ < *(float *)(uVar10 + 0xf0) &&
                           *(float *)(uVar10 + 0xe0) <= auVar21._0_4_) & auVar29._0_4_) << 0x1f;
              auVar19._4_4_ =
                   (-(uint)(auVar21._4_4_ < *(float *)(uVar10 + 0xf4) &&
                           *(float *)(uVar10 + 0xe4) <= auVar21._4_4_) & auVar29._4_4_) << 0x1f;
              auVar19._8_4_ =
                   (-(uint)(auVar21._8_4_ < *(float *)(uVar10 + 0xf8) &&
                           *(float *)(uVar10 + 0xe8) <= auVar21._8_4_) & auVar29._8_4_) << 0x1f;
              auVar19._12_4_ =
                   (-(uint)(auVar21._12_4_ < *(float *)(uVar10 + 0xfc) &&
                           *(float *)(uVar10 + 0xec) <= auVar21._12_4_) & auVar29._12_4_) << 0x1f;
              uVar16 = movmskps((int)local_1018,auVar19);
              local_1018 = CONCAT44(uVar18,uVar16);
            }
          }
          else if ((uVar11 & 8) == 0) {
            uVar10 = uVar11 & 0xfffffffffffffff0;
            fVar35 = query->time;
            auVar21._4_4_ = fVar35;
            auVar21._0_4_ = fVar35;
            auVar21._8_4_ = fVar35;
            auVar21._12_4_ = fVar35;
            auVar38._0_4_ = *(float *)(uVar10 + 0x80) * fVar35 + *(float *)(uVar10 + 0x20);
            auVar38._4_4_ = *(float *)(uVar10 + 0x84) * fVar35 + *(float *)(uVar10 + 0x24);
            auVar38._8_4_ = *(float *)(uVar10 + 0x88) * fVar35 + *(float *)(uVar10 + 0x28);
            auVar38._12_4_ = *(float *)(uVar10 + 0x8c) * fVar35 + *(float *)(uVar10 + 0x2c);
            auVar34._0_4_ = *(float *)(uVar10 + 0xa0) * fVar35 + *(float *)(uVar10 + 0x40);
            auVar34._4_4_ = *(float *)(uVar10 + 0xa4) * fVar35 + *(float *)(uVar10 + 0x44);
            auVar34._8_4_ = *(float *)(uVar10 + 0xa8) * fVar35 + *(float *)(uVar10 + 0x48);
            auVar34._12_4_ = *(float *)(uVar10 + 0xac) * fVar35 + *(float *)(uVar10 + 0x4c);
            auVar50._0_4_ = *(float *)(uVar10 + 0xc0) * fVar35 + *(float *)(uVar10 + 0x60);
            auVar50._4_4_ = *(float *)(uVar10 + 0xc4) * fVar35 + *(float *)(uVar10 + 100);
            auVar50._8_4_ = *(float *)(uVar10 + 200) * fVar35 + *(float *)(uVar10 + 0x68);
            auVar50._12_4_ = *(float *)(uVar10 + 0xcc) * fVar35 + *(float *)(uVar10 + 0x6c);
            auVar48._0_4_ = *(float *)(uVar10 + 0x90) * fVar35 + *(float *)(uVar10 + 0x30);
            auVar48._4_4_ = *(float *)(uVar10 + 0x94) * fVar35 + *(float *)(uVar10 + 0x34);
            auVar48._8_4_ = *(float *)(uVar10 + 0x98) * fVar35 + *(float *)(uVar10 + 0x38);
            auVar48._12_4_ = *(float *)(uVar10 + 0x9c) * fVar35 + *(float *)(uVar10 + 0x3c);
            auVar46._0_4_ = *(float *)(uVar10 + 0xb0) * fVar35 + *(float *)(uVar10 + 0x50);
            auVar46._4_4_ = *(float *)(uVar10 + 0xb4) * fVar35 + *(float *)(uVar10 + 0x54);
            auVar46._8_4_ = *(float *)(uVar10 + 0xb8) * fVar35 + *(float *)(uVar10 + 0x58);
            auVar46._12_4_ = *(float *)(uVar10 + 0xbc) * fVar35 + *(float *)(uVar10 + 0x5c);
            auVar43._0_4_ = *(float *)(uVar10 + 0xd0) * fVar35 + *(float *)(uVar10 + 0x70);
            auVar43._4_4_ = *(float *)(uVar10 + 0xd4) * fVar35 + *(float *)(uVar10 + 0x74);
            auVar43._8_4_ = *(float *)(uVar10 + 0xd8) * fVar35 + *(float *)(uVar10 + 0x78);
            auVar43._12_4_ = *(float *)(uVar10 + 0xdc) * fVar35 + *(float *)(uVar10 + 0x7c);
            auVar29 = maxps(_local_1038,auVar38);
            auVar29 = minps(auVar29,auVar48);
            fVar35 = auVar29._0_4_ - (float)local_1038._4_4_;
            fVar40 = auVar29._4_4_ - (float)local_1038._4_4_;
            fVar49 = auVar29._8_4_ - (float)local_1038._4_4_;
            fVar52 = auVar29._12_4_ - (float)local_1038._4_4_;
            auVar29 = maxps(_local_1048,auVar34);
            auVar29 = minps(auVar29,auVar46);
            fVar54 = auVar29._0_4_ - (float)local_1048._4_4_;
            fVar55 = auVar29._4_4_ - (float)local_1048._4_4_;
            fVar56 = auVar29._8_4_ - (float)local_1048._4_4_;
            fVar57 = auVar29._12_4_ - (float)local_1048._4_4_;
            auVar29 = maxps(_local_1058,auVar50);
            auVar29 = minps(auVar29,auVar43);
            fVar39 = auVar29._0_4_ - (float)local_1058._4_4_;
            fVar41 = auVar29._4_4_ - (float)local_1058._4_4_;
            fVar51 = auVar29._8_4_ - (float)local_1058._4_4_;
            fVar53 = auVar29._12_4_ - (float)local_1058._4_4_;
            local_1028[0] = fVar39 * fVar39 + fVar54 * fVar54 + fVar35 * fVar35;
            local_1028[1] = fVar41 * fVar41 + fVar55 * fVar55 + fVar40 * fVar40;
            local_1028[2] = fVar51 * fVar51 + fVar56 * fVar56 + fVar49 * fVar49;
            local_1028[3] = fVar53 * fVar53 + fVar57 * fVar57 + fVar52 * fVar52;
            uVar4 = (uint)(((auVar50._0_4_ <= (float)local_fb8._0_4_ && local_fc8 <= auVar48._0_4_)
                           && (auVar34._0_4_ <= local_fa8 && auVar38._0_4_ <= local_fd8)) &&
                          ((float)local_ff8._0_4_ <= auVar43._0_4_ &&
                          ((float)local_fe8._0_4_ <= auVar46._0_4_ && auVar38._0_4_ <= auVar48._0_4_
                          )));
            auVar29._0_4_ = -uVar4;
            uVar5 = (uint)(((auVar50._4_4_ <= (float)local_fb8._4_4_ && fStack_fc4 <= auVar48._4_4_)
                           && (auVar34._4_4_ <= fStack_fa4 && auVar38._4_4_ <= fStack_fd4)) &&
                          ((float)local_ff8._4_4_ <= auVar43._4_4_ &&
                          ((float)local_fe8._4_4_ <= auVar46._4_4_ && auVar38._4_4_ <= auVar48._4_4_
                          )));
            auVar29._4_4_ = -uVar5;
            uVar3 = (uint)(((auVar50._8_4_ <= fStack_fb0 && fStack_fc0 <= auVar48._8_4_) &&
                           (auVar34._8_4_ <= fStack_fa0 && auVar38._8_4_ <= fStack_fd0)) &&
                          (fStack_ff0 <= auVar43._8_4_ &&
                          (fStack_fe0 <= auVar46._8_4_ && auVar38._8_4_ <= auVar48._8_4_)));
            auVar29._8_4_ = -uVar3;
            uVar1 = (uint)(((auVar50._12_4_ <= fStack_fac && fStack_fbc <= auVar48._12_4_) &&
                           (auVar34._12_4_ <= fStack_f9c && auVar38._12_4_ <= fStack_fcc)) &&
                          (fStack_fec <= auVar43._12_4_ &&
                          (fStack_fdc <= auVar46._12_4_ && auVar38._12_4_ <= auVar48._12_4_)));
            auVar29._12_4_ = -uVar1;
            if (((uint)uVar11 & 7) == 6) goto LAB_00dfd299;
            auVar29._0_4_ = uVar4 * -0x80000000;
            auVar29._4_4_ = uVar5 * -0x80000000;
            auVar29._8_4_ = uVar3 * -0x80000000;
            auVar29._12_4_ = uVar1 * -0x80000000;
LAB_00dfd10c:
            uVar16 = movmskps((int)local_1018,auVar29);
            local_1018 = CONCAT44(uVar18,uVar16);
          }
          if ((uVar11 & 8) == 0) {
            if (local_1018 == 0) {
              iVar9 = 4;
            }
            else {
              uVar10 = uVar11 & 0xfffffffffffffff0;
              lVar12 = 0;
              if (local_1018 != 0) {
                for (; (local_1018 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              iVar9 = 0;
              uVar11 = *(ulong *)(uVar10 + lVar12 * 8);
              uVar13 = local_1018 - 1 & local_1018;
              if (uVar13 != 0) {
                fVar35 = local_1028[lVar12];
                lVar12 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                uVar2 = *(ulong *)(uVar10 + lVar12 * 8);
                fVar39 = local_1028[lVar12];
                uVar13 = uVar13 - 1 & uVar13;
                if (uVar13 == 0) {
                  if ((uint)fVar35 < (uint)fVar39) {
                    *(ulong *)*local_1010 = uVar2;
                    *(float *)(*local_1010 + 8) = fVar39;
                    local_1010 = local_1010 + 1;
                  }
                  else {
                    *(ulong *)*local_1010 = uVar11;
                    *(float *)(*local_1010 + 8) = fVar35;
                    uVar11 = uVar2;
                    local_1010 = local_1010 + 1;
                  }
                }
                else {
                  auVar20._8_4_ = fVar35;
                  auVar20._0_8_ = uVar11;
                  auVar20._12_4_ = 0;
                  auVar25._8_4_ = fVar39;
                  auVar25._0_8_ = uVar2;
                  auVar25._12_4_ = 0;
                  lVar12 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                    }
                  }
                  uVar11 = *(ulong *)(uVar10 + lVar12 * 8);
                  fVar40 = local_1028[lVar12];
                  auVar28._8_4_ = fVar40;
                  auVar28._0_8_ = uVar11;
                  auVar28._12_4_ = 0;
                  uVar13 = uVar13 - 1 & uVar13;
                  if (uVar13 == 0) {
                    auVar32._8_4_ = -(uint)((int)fVar35 < (int)fVar39);
                    auVar32._4_4_ = auVar32._8_4_;
                    auVar32._0_4_ = auVar32._8_4_;
                    auVar32._12_4_ = auVar32._8_4_;
                    auVar21 = auVar20 & auVar32 | ~auVar32 & auVar25;
                    auVar50 = auVar25 & auVar32 | ~auVar32 & auVar20;
                    auVar33._8_4_ = -(uint)(auVar21._8_4_ < (int)fVar40);
                    auVar33._0_8_ = CONCAT44(auVar33._8_4_,auVar33._8_4_);
                    auVar33._12_4_ = auVar33._8_4_;
                    auVar29 = auVar28 & auVar33 | ~auVar33 & auVar21;
                    auVar22._8_4_ = -(uint)(auVar50._8_4_ < auVar29._8_4_);
                    auVar22._4_4_ = auVar22._8_4_;
                    auVar22._0_4_ = auVar22._8_4_;
                    auVar22._12_4_ = auVar22._8_4_;
                    *local_1010 = ~auVar22 & auVar50 | auVar29 & auVar22;
                    local_1010[1] = auVar50 & auVar22 | ~auVar22 & auVar29;
                    uVar11 = ~auVar33._0_8_ & uVar11 | auVar21._0_8_ & auVar33._0_8_;
                    local_1010 = local_1010 + 2;
                  }
                  else {
                    lVar12 = 0;
                    if (uVar13 != 0) {
                      for (; (uVar13 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                      }
                    }
                    fVar41 = local_1028[lVar12];
                    auVar37._8_4_ = fVar41;
                    auVar37._0_8_ = *(undefined8 *)(uVar10 + lVar12 * 8);
                    auVar37._12_4_ = 0;
                    auVar44._8_4_ = -(uint)((int)fVar35 < (int)fVar39);
                    auVar44._4_4_ = auVar44._8_4_;
                    auVar44._0_4_ = auVar44._8_4_;
                    auVar44._12_4_ = auVar44._8_4_;
                    auVar21 = auVar20 & auVar44 | ~auVar44 & auVar25;
                    auVar50 = auVar25 & auVar44 | ~auVar44 & auVar20;
                    auVar47._0_4_ = -(uint)((int)fVar40 < (int)fVar41);
                    auVar47._4_4_ = -(uint)((int)fVar40 < (int)fVar41);
                    auVar47._8_4_ = -(uint)((int)fVar40 < (int)fVar41);
                    auVar47._12_4_ = -(uint)((int)fVar40 < (int)fVar41);
                    auVar34 = auVar28 & auVar47 | ~auVar47 & auVar37;
                    auVar48 = ~auVar47 & auVar28 | auVar37 & auVar47;
                    auVar30._8_4_ = -(uint)(auVar50._8_4_ < auVar48._8_4_);
                    auVar30._4_4_ = auVar30._8_4_;
                    auVar30._0_4_ = auVar30._8_4_;
                    auVar30._12_4_ = auVar30._8_4_;
                    auVar38 = auVar50 & auVar30 | ~auVar30 & auVar48;
                    auVar26._8_4_ = -(uint)(auVar21._8_4_ < auVar34._8_4_);
                    auVar26._0_8_ = CONCAT44(auVar26._8_4_,auVar26._8_4_);
                    auVar26._12_4_ = auVar26._8_4_;
                    auVar29 = ~auVar26 & auVar21 | auVar34 & auVar26;
                    auVar23._8_4_ = -(uint)(auVar29._8_4_ < auVar38._8_4_);
                    auVar23._4_4_ = auVar23._8_4_;
                    auVar23._0_4_ = auVar23._8_4_;
                    auVar23._12_4_ = auVar23._8_4_;
                    *local_1010 = ~auVar30 & auVar50 | auVar48 & auVar30;
                    local_1010[1] = ~auVar23 & auVar29 | auVar38 & auVar23;
                    local_1010[2] = auVar29 & auVar23 | ~auVar23 & auVar38;
                    uVar11 = auVar21._0_8_ & auVar26._0_8_ | ~auVar26._0_8_ & auVar34._0_8_;
                    local_1010 = local_1010 + 3;
                    iVar9 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar9 = 6;
          }
        } while (iVar9 == 0);
      } while ((iVar9 != 6) || (local_1008 = (ulong)((uint)uVar11 & 0xf) - 8, local_1008 == 0));
      lVar12 = (uVar11 & 0xfffffffffffffff0) + 0x50;
      lVar17 = 0;
      uVar11 = 0;
      do {
        local_1000 = uVar11;
        bVar14 = 0;
        lVar15 = 0;
        do {
          if (*(int *)(lVar12 + lVar15 * 4) == -1) break;
          uVar1 = *(uint *)(lVar12 + -0x10 + lVar15 * 4);
          this = (context->scene->geometries).items[uVar1].ptr;
          context->geomID = uVar1;
          context->primID = *(uint *)(lVar12 + lVar15 * 4);
          bVar7 = Geometry::pointQuery(this,query,context);
          bVar14 = bVar14 | bVar7;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        uVar11 = CONCAT71((int7)(local_1000 >> 8),(byte)local_1000 | bVar14);
        lVar17 = lVar17 + 1;
        lVar12 = lVar12 + 0x60;
      } while (lVar17 != local_1008);
      fVar58 = local_f98;
    } while ((local_1000 & 1) == 0 && bVar14 == 0);
    fVar58 = (context->query_radius).field_0.m128[0];
    fVar35 = (context->query_radius).field_0.m128[1];
    fVar39 = (context->query_radius).field_0.m128[2];
    fStack_f94 = (context->query_radius).field_0.m128[3];
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      fStack_f90 = 0.0;
      fStack_f94 = 0.0;
      local_f98 = query->radius * query->radius;
    }
    else {
      fStack_f90 = fVar39 * fVar39;
      fStack_f94 = fStack_f94 * fStack_f94;
      local_f98 = fStack_f90 + fVar35 * fVar35 + fVar58 * fVar58;
    }
    bVar8 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }